

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# boxed_value.hpp
# Opt level: O1

shared_ptr<chaiscript::Boxed_Value::Data> __thiscall
chaiscript::Boxed_Value::Object_Data::get<chaiscript::dispatch::Dynamic_Object>
          (Object_Data *this,Dynamic_Object *t,bool t_return_value)

{
  Dynamic_Object *pDVar1;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  undefined8 *puVar3;
  undefined8 *puVar4;
  pointer_____offset_0x10___ *ppuVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  shared_ptr<chaiscript::Boxed_Value::Data> sVar6;
  shared_ptr<chaiscript::dispatch::Dynamic_Object> p;
  undefined1 local_39;
  Dynamic_Object *local_38;
  __shared_count<(__gnu_cxx::_Lock_policy)2> a_Stack_30 [2];
  
  local_38 = (Dynamic_Object *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<chaiscript::dispatch::Dynamic_Object,std::allocator<chaiscript::dispatch::Dynamic_Object>,chaiscript::dispatch::Dynamic_Object>
            (a_Stack_30,&local_38,(allocator<chaiscript::dispatch::Dynamic_Object> *)&local_39,t);
  pDVar1 = local_38;
  puVar3 = (undefined8 *)operator_new(0x20);
  _Var2._M_pi = a_Stack_30[0]._M_pi;
  local_38 = (Dynamic_Object *)0x0;
  a_Stack_30[0]._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  puVar3[1] = &std::shared_ptr<chaiscript::dispatch::Dynamic_Object>::typeinfo;
  *puVar3 = &PTR__Data_Impl_00402280;
  puVar3[2] = pDVar1;
  puVar3[3] = _Var2._M_pi;
  *(undefined8 *)this = 0;
  puVar4 = (undefined8 *)operator_new(0x50);
  puVar4[1] = 0x100000001;
  *puVar4 = &PTR___Sp_counted_ptr_inplace_003fb838;
  ppuVar5 = &dispatch::Dynamic_Object::typeinfo;
  puVar4[2] = &dispatch::Dynamic_Object::typeinfo;
  puVar4[3] = &dispatch::Dynamic_Object::typeinfo;
  *(undefined4 *)(puVar4 + 4) = 0;
  puVar4[5] = puVar3;
  puVar4[6] = pDVar1;
  puVar4[7] = pDVar1;
  puVar4[8] = 0;
  *(undefined1 *)(puVar4 + 9) = 0;
  *(bool *)((long)puVar4 + 0x49) = t_return_value;
  *(undefined8 **)(this + 8) = puVar4;
  *(undefined8 **)this = puVar4 + 2;
  if (a_Stack_30[0]._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(a_Stack_30[0]._M_pi);
    ppuVar5 = (pointer_____offset_0x10___ *)extraout_RDX;
  }
  sVar6.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)ppuVar5;
  sVar6.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (shared_ptr<chaiscript::Boxed_Value::Data>)
         sVar6.super___shared_ptr<chaiscript::Boxed_Value::Data,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

static auto get(T t, bool t_return_value) {
        auto p = std::make_shared<T>(std::move(t));
        auto ptr = p.get();
        return std::make_shared<Data>(detail::Get_Type_Info<T>::get(), chaiscript::detail::Any(std::move(p)), false, ptr, t_return_value);
      }